

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

IndexedMatrixArray * __thiscall
stateObservation::tools::Logger::getRecord(Logger *this,void *address)

{
  iterator iVar1;
  void *address_local;
  
  address_local = address;
  iVar1 = std::
          _Rb_tree<const_void_*,_std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>,_std::_Select1st<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>_>
          ::find(&(this->logs_)._M_t,&address_local);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->logs_)._M_t._M_impl.super__Rb_tree_header) {
    return (IndexedMatrixArray *)&iVar1._M_node[1]._M_parent;
  }
  __assert_fail("false && \"The logger cannot find the data, please use record function\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/logger.cpp"
                ,0x3b,"IndexedMatrixArray &stateObservation::tools::Logger::getRecord(const void *)"
               );
}

Assistant:

IndexedMatrixArray & Logger::getRecord(const void* address)
    {
      Tmap::iterator i= logs_.find(address);
      if (i==logs_.end())
      {
        BOOST_ASSERT(false && "The logger cannot find the data, please use record function");
        throw std::invalid_argument
                ("The logger cannot find the data, please use record function");
      }
      else
        return i->second.array;
    }